

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O2

IRIns * sink_checkalloc(jit_State *J,IRIns *irs)

{
  IRIns *pIVar1;
  IRIns *pIVar2;
  IRIns *pIVar3;
  ulong uVar4;
  
  pIVar1 = (J->cur).ir;
  if (*(short *)((long)pIVar1 + (ulong)(irs->field_0).op1 * 8 + 2) < 0) {
    return (IRIns *)0x0;
  }
  pIVar3 = pIVar1 + (irs->field_0).op1;
  uVar4 = (ulong)(pIVar3->field_1).o;
  pIVar2 = (IRIns *)0x0;
  if (uVar4 < 0x3f) {
    if ((0x4c00010000000000U >> (uVar4 & 0x3f) & 1) == 0) {
      if ((0x300000000000000U >> (uVar4 & 0x3f) & 1) == 0) {
        return (IRIns *)0x0;
      }
      pIVar3 = pIVar1 + (pIVar3->field_0).op1;
    }
    pIVar2 = (IRIns *)0x0;
    if ((byte)(pIVar1[(pIVar3->field_0).op1].field_1.o + 0xb2) < 3) {
      pIVar2 = pIVar1 + (pIVar3->field_0).op1;
    }
  }
  return pIVar2;
}

Assistant:

static IRIns *sink_checkalloc(jit_State *J, IRIns *irs)
{
  IRIns *ir = IR(irs->op1);
  if (!irref_isk(ir->op2))
    return NULL;  /* Non-constant key. */
  if (ir->o == IR_HREFK || ir->o == IR_AREF)
    ir = IR(ir->op1);
  else if (!(ir->o == IR_HREF || ir->o == IR_NEWREF ||
	     ir->o == IR_FREF || ir->o == IR_ADD))
    return NULL;  /* Unhandled reference type (for XSTORE). */
  ir = IR(ir->op1);
  if (!(ir->o == IR_TNEW || ir->o == IR_TDUP || ir->o == IR_CNEW))
    return NULL;  /* Not an allocation. */
  return ir;  /* Return allocation. */
}